

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmc_ptr_queue.hpp
# Opt level: O2

agent_queue_t * __thiscall
so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>::pop
          (mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t> *this,
          condition_t *condition)

{
  _Head_base<0UL,_so_5::disp::mpmc_queue_traits::lock_t_*,_false> _Var1;
  _Elt_pointer ppaVar2;
  condition_t *in_RAX;
  agent_queue_t *paVar3;
  condition_t *local_38;
  
  _Var1._M_head_impl =
       (this->m_lock)._M_t.
       super___uniq_ptr_impl<so_5::disp::mpmc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpmc_queue_traits::lock_t>_>
       ._M_t.
       super__Tuple_impl<0UL,_so_5::disp::mpmc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpmc_queue_traits::lock_t>_>
       .super__Head_base<0UL,_so_5::disp::mpmc_queue_traits::lock_t_*,_false>._M_head_impl;
  local_38 = in_RAX;
  (*(_Var1._M_head_impl)->_vptr_lock_t[2])(_Var1._M_head_impl);
  paVar3 = (agent_queue_t *)0x0;
  do {
    if (this->m_shutdown != false) {
LAB_00275132:
      (*(_Var1._M_head_impl)->_vptr_lock_t[3])(_Var1._M_head_impl);
      return paVar3;
    }
    ppaVar2 = (this->m_queue).
              super__Deque_base<so_5::disp::adv_thread_pool::impl::agent_queue_t_*,_std::allocator<so_5::disp::adv_thread_pool::impl::agent_queue_t_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->m_queue).
        super__Deque_base<so_5::disp::adv_thread_pool::impl::agent_queue_t_*,_std::allocator<so_5::disp::adv_thread_pool::impl::agent_queue_t_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur != ppaVar2) {
      paVar3 = *ppaVar2;
      std::
      deque<so_5::disp::adv_thread_pool::impl::agent_queue_t_*,_std::allocator<so_5::disp::adv_thread_pool::impl::agent_queue_t_*>_>
      ::pop_front(&this->m_queue);
      try_wakeup_someone_if_possible(this);
      goto LAB_00275132;
    }
    local_38 = condition;
    std::
    vector<so_5::disp::mpmc_queue_traits::condition_t*,std::allocator<so_5::disp::mpmc_queue_traits::condition_t*>>
    ::emplace_back<so_5::disp::mpmc_queue_traits::condition_t*>
              ((vector<so_5::disp::mpmc_queue_traits::condition_t*,std::allocator<so_5::disp::mpmc_queue_traits::condition_t*>>
                *)&this->m_waiting_customers,&local_38);
    (*condition->_vptr_condition_t[2])(condition);
    this->m_wakeup_in_progress = false;
  } while( true );
}

Assistant:

inline T *
		pop( so_5::disp::mpmc_queue_traits::condition_t & condition )
			{
				std::lock_guard< so_5::disp::mpmc_queue_traits::lock_t > lock{ *m_lock };

				do
					{
						if( m_shutdown )
							break;

						if( !m_queue.empty() )
							{
								auto r = m_queue.front();
								m_queue.pop_front();

								// There could be non-empty queue and sleeping workers...
								try_wakeup_someone_if_possible();

								return r;
							}

						m_waiting_customers.push_back( &condition );

						condition.wait();
						// If we are here then the current wakeup procedure is
						// finished.
						m_wakeup_in_progress = false;
					}
				while( true );

				return nullptr;
			}